

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::itemForKeyEnd(QTreeViewPrivate *this)

{
  bool bVar1;
  qsizetype qVar2;
  QTreeViewPrivate *in_RDI;
  int index;
  int local_20;
  QTreeViewPrivate *this_00;
  
  this_00 = in_RDI;
  qVar2 = QList<QTreeViewItem>::size(&in_RDI->viewItems);
  local_20 = (int)qVar2;
  do {
    local_20 = local_20 + -1;
    bVar1 = isItemHiddenOrDisabled(this_00,local_20);
  } while (bVar1);
  if (local_20 == -1) {
    qVar2 = QList<QTreeViewItem>::size(&in_RDI->viewItems);
    local_20 = (int)qVar2 + -1;
  }
  return local_20;
}

Assistant:

int QTreeViewPrivate::itemForKeyEnd() const
{
    int index = viewItems.size() - 1;
    while (isItemHiddenOrDisabled(index))
        index--;
    return index == -1 ? viewItems.size() - 1 : index;
}